

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<BreakStatementAstNode>_> * __thiscall
Parser::parseBreakStatement
          (optional<std::shared_ptr<BreakStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  shared_ptr<BreakStatementAstNode> local_a0;
  undefined4 local_90;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Token> breakToken;
  bool error;
  Parser *this_local;
  
  breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a break",(allocator<char> *)(local_68 + 0x17));
  expect((Parser *)local_30,(TokenType)this,(bool *)0xb,
         (string *)
         ((long)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected a semicolon after break",&local_89);
  expect((Parser *)local_68,(TokenType)this,(bool *)0x10,
         (string *)
         ((long)&breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 7));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  if ((breakToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1)
      == 0) {
    std::make_shared<BreakStatementAstNode,std::shared_ptr<Token>&>((shared_ptr<Token> *)&local_a0);
    std::optional<std::shared_ptr<BreakStatementAstNode>_>::
    optional<std::shared_ptr<BreakStatementAstNode>,_true>(__return_storage_ptr__,&local_a0);
    std::shared_ptr<BreakStatementAstNode>::~shared_ptr(&local_a0);
  }
  else {
    std::optional<std::shared_ptr<BreakStatementAstNode>_>::optional(__return_storage_ptr__);
  }
  local_90 = 1;
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<BreakStatementAstNode>>
Parser::parseBreakStatement() noexcept {
  bool error = false;

  auto breakToken = this->expect(TokenType::Break, error, "Expected a break");

  this->skipWhiteSpace();

  this->expect(TokenType::SemiColon, error, "Expected a semicolon after break");

  if (error) { return std::nullopt; }

  return std::make_shared<BreakStatementAstNode>(breakToken);
}